

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::VariableDatum::GetDatumValueAsKString_abi_cxx11_
          (KString *__return_storage_ptr__,VariableDatum *this)

{
  ulong uVar1;
  KString *pKVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pDVar5;
  pointer pDVar6;
  bool bVar7;
  double dVar8;
  KStringStream ss;
  KOCTET local_1d1;
  KString *local_1d0;
  pointer local_1c8;
  ulong local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pDVar6 = (this->m_v8DatumValue).
           super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar5 = (this->m_v8DatumValue).
           super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  dVar8 = ceil((double)this->m_ui32DatumLength * 0.125);
  if (pDVar6 != pDVar5) {
    uVar3 = 0;
    local_1c8 = pDVar5;
    do {
      if ((uint)uVar3 < (uint)(long)dVar8) {
        uVar4 = 0;
        local_1c0 = uVar3;
        do {
          local_1d1 = pDVar6->Buffer[uVar4];
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1d1,1);
          uVar1 = uVar4 + 1;
          if ((uint)(long)dVar8 <= (int)uVar4 + (uint)uVar3 + 1) break;
          bVar7 = uVar4 < 7;
          uVar4 = uVar1;
        } while (bVar7);
        uVar3 = (ulong)(uint)((int)local_1c0 + (int)uVar1);
        pDVar5 = local_1c8;
      }
      pDVar6 = pDVar6 + 1;
    } while (pDVar6 != pDVar5);
  }
  pKVar2 = local_1d0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar2;
}

Assistant:

KString VariableDatum::GetDatumValueAsKString() const
{
    KStringStream ss;

    vector<DatumEntry>::const_iterator citr =  m_v8DatumValue.begin();
    vector<DatumEntry>::const_iterator citrEnd = m_v8DatumValue.end();

    KUINT32 i = 0;

    KUINT32 ui32LengthInOctets = ceil(m_ui32DatumLength / 8.0);

    while( citr != citrEnd )
    {
        for( KUINT16 j = 0; i < ui32LengthInOctets && j < 8; ++j, ++i )
        {
            ss << citr->Buffer[j];
        }
        ++citr;
    }

    return ss.str();
}